

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O2

void highbd_quantize_fp_helper_c
               (tran_low_t *coeff_ptr,intptr_t count,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,qm_val_t *qm_ptr,qm_val_t *iqm_ptr,int log_scale)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  short sVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  int local_48 [6];
  int log_scaled_round_arr [2];
  
  bVar3 = (byte)iscan;
  if (eob_ptr == (uint16_t *)0x0 && scan == (int16_t *)0x0) {
    iVar13 = (1 << (bVar3 & 0x1f)) >> 1;
    local_48[0] = *zbin_ptr + iVar13 >> (bVar3 & 0x1f);
    local_48[1] = zbin_ptr[1] + iVar13 >> (bVar3 & 0x1f);
    uVar15 = 0;
    if (count < 1) {
      count = uVar15;
    }
    uVar10 = 0xffffffff;
    for (; sVar9 = (short)uVar10, count != uVar15; uVar15 = uVar15 + 1) {
      lVar4 = (long)dequant_ptr[uVar15];
      uVar8 = (ulong)(lVar4 != 0);
      iVar13 = coeff_ptr[lVar4];
      iVar2 = -iVar13;
      if (0 < iVar13) {
        iVar2 = iVar13;
      }
      iVar5 = (int)*(short *)((long)qcoeff_ptr + uVar8 * 2);
      iVar12 = 0;
      if (iVar2 << (bVar3 + 1 & 0x1f) < iVar5) {
        iVar13 = 0;
      }
      else {
        uVar6 = iVar13 >> 0x1f;
        uVar7 = (uint)(((long)iVar2 + (long)local_48[uVar8]) * (long)round_ptr[uVar8] >>
                      (0x10 - bVar3 & 0x3f));
        iVar12 = (uVar6 ^ uVar7) - uVar6;
        if (uVar7 != 0) {
          uVar10 = uVar15 & 0xffffffff;
        }
        iVar13 = ((int)(iVar5 * uVar7) >> (bVar3 & 0x1f) ^ uVar6) - uVar6;
      }
      *(int *)(quant_ptr + lVar4 * 2) = iVar12;
      *(int *)(quant_shift_ptr + lVar4 * 2) = iVar13;
    }
  }
  else {
    uVar15 = 0;
    if (count < 1) {
      count = uVar15;
    }
    uVar10 = 0xffffffff;
    for (; sVar9 = (short)uVar10, count != uVar15; uVar15 = uVar15 + 1) {
      sVar9 = dequant_ptr[uVar15];
      lVar4 = (long)sVar9;
      uVar8 = 0x20;
      if (eob_ptr != (uint16_t *)0x0) {
        uVar8 = (ulong)*(byte *)((long)eob_ptr + lVar4);
      }
      uVar6 = 0x20;
      if (scan != (int16_t *)0x0) {
        uVar6 = (uint)*(byte *)((long)scan + lVar4);
      }
      iVar13 = coeff_ptr[lVar4];
      iVar2 = -iVar13;
      if (0 < iVar13) {
        iVar2 = iVar13;
      }
      iVar12 = (int)*(short *)((long)qcoeff_ptr + (ulong)(sVar9 != 0) * 2);
      bVar1 = 4 - bVar3 & 0x1f;
      iVar5 = 0 << bVar1;
      if ((long)(uVar8 * (long)iVar2) < (long)(iVar12 << bVar1)) {
        iVar13 = 0;
      }
      else {
        uVar14 = iVar13 >> 0x1f;
        uVar11 = (ulong)((uint)(sVar9 != 0) * 2);
        uVar7 = (uint)((long)(uVar8 * (long)*(short *)((long)round_ptr + uVar11) *
                             ((long)((int)*(short *)((long)zbin_ptr + uVar11) +
                                     ((1 << (bVar3 & 0x1f)) >> 1) >> (bVar3 & 0x1f)) + (long)iVar2))
                      >> (0x15 - bVar3 & 0x3f));
        iVar5 = (uVar14 ^ uVar7) - uVar14;
        iVar13 = ((int)(((int)(uVar6 * iVar12 + 0x10) >> 5) * uVar7) >> (bVar3 & 0x1f) ^ uVar14) -
                 uVar14;
        if (uVar7 != 0) {
          uVar10 = uVar15 & 0xffffffff;
        }
      }
      *(int *)(quant_ptr + lVar4 * 2) = iVar5;
      *(int *)(quant_shift_ptr + lVar4 * 2) = iVar13;
    }
  }
  *(short *)dqcoeff_ptr = sVar9 + 1;
  return;
}

Assistant:

static void highbd_quantize_fp_helper_c(
    const tran_low_t *coeff_ptr, intptr_t count, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan, const qm_val_t *qm_ptr,
    const qm_val_t *iqm_ptr, int log_scale) {
  int i;
  int eob = -1;
  const int shift = 16 - log_scale;
  // TODO(jingning) Decide the need of these arguments after the
  // quantization process is completed.
  (void)zbin_ptr;
  (void)quant_shift_ptr;
  (void)iscan;

  if (qm_ptr || iqm_ptr) {
    // Quantization pass: All coefficients with index >= zero_flag are
    // skippable. Note: zero_flag can be zero.
    for (i = 0; i < count; i++) {
      const int rc = scan[i];
      const int coeff = coeff_ptr[rc];
      const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
      const qm_val_t iwt = iqm_ptr != NULL ? iqm_ptr[rc] : (1 << AOM_QM_BITS);
      const int dequant =
          (dequant_ptr[rc != 0] * iwt + (1 << (AOM_QM_BITS - 1))) >>
          AOM_QM_BITS;
      const int coeff_sign = AOMSIGN(coeff);
      const int64_t abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      int abs_qcoeff = 0;
      if (abs_coeff * wt >=
          (dequant_ptr[rc != 0] << (AOM_QM_BITS - (1 + log_scale)))) {
        const int64_t tmp =
            abs_coeff + ROUND_POWER_OF_TWO(round_ptr[rc != 0], log_scale);
        abs_qcoeff =
            (int)((tmp * quant_ptr[rc != 0] * wt) >> (shift + AOM_QM_BITS));
        qcoeff_ptr[rc] = (tran_low_t)((abs_qcoeff ^ coeff_sign) - coeff_sign);
        const tran_low_t abs_dqcoeff = (abs_qcoeff * dequant) >> log_scale;
        dqcoeff_ptr[rc] = (tran_low_t)((abs_dqcoeff ^ coeff_sign) - coeff_sign);
        if (abs_qcoeff) eob = i;
      } else {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
      }
    }
  } else {
    const int log_scaled_round_arr[2] = {
      ROUND_POWER_OF_TWO(round_ptr[0], log_scale),
      ROUND_POWER_OF_TWO(round_ptr[1], log_scale),
    };
    for (i = 0; i < count; i++) {
      const int rc = scan[i];
      const int coeff = coeff_ptr[rc];
      const int rc01 = (rc != 0);
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int log_scaled_round = log_scaled_round_arr[rc01];
      if ((abs_coeff << (1 + log_scale)) >= dequant_ptr[rc01]) {
        const int quant = quant_ptr[rc01];
        const int dequant = dequant_ptr[rc01];
        const int64_t tmp = (int64_t)abs_coeff + log_scaled_round;
        const int abs_qcoeff = (int)((tmp * quant) >> shift);
        qcoeff_ptr[rc] = (tran_low_t)((abs_qcoeff ^ coeff_sign) - coeff_sign);
        const tran_low_t abs_dqcoeff = (abs_qcoeff * dequant) >> log_scale;
        if (abs_qcoeff) eob = i;
        dqcoeff_ptr[rc] = (tran_low_t)((abs_dqcoeff ^ coeff_sign) - coeff_sign);
      } else {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
      }
    }
  }
  *eob_ptr = eob + 1;
}